

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

xmlAutomataStatePtr
xmlAutomataNewAllTrans(xmlAutomataPtr am,xmlAutomataStatePtr from,xmlAutomataStatePtr to,int lax)

{
  int lax_local;
  xmlAutomataStatePtr to_local;
  xmlAutomataStatePtr from_local;
  xmlAutomataPtr am_local;
  
  if ((am == (xmlAutomataPtr)0x0) || (from == (xmlAutomataStatePtr)0x0)) {
    am_local = (xmlAutomataPtr)0x0;
  }
  else {
    xmlFAGenerateAllTransition(am,from,to,lax);
    am_local = (xmlAutomataPtr)to;
    if (to == (xmlAutomataStatePtr)0x0) {
      am_local = (xmlAutomataPtr)am->state;
    }
  }
  return (xmlAutomataStatePtr)am_local;
}

Assistant:

xmlAutomataStatePtr
xmlAutomataNewAllTrans(xmlAutomataPtr am, xmlAutomataStatePtr from,
		       xmlAutomataStatePtr to, int lax) {
    if ((am == NULL) || (from == NULL))
	return(NULL);
    xmlFAGenerateAllTransition(am, from, to, lax);
    if (to == NULL)
	return(am->state);
    return(to);
}